

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveDisplayer.cpp
# Opt level: O3

void __thiscall
PrimitiveDisplayer::drawableWithManualRotation(PrimitiveDisplayer *this,Drawable *drawable)

{
  float fVar1;
  undefined8 *puVar2;
  Quad *quad;
  int iVar3;
  Vec2d *pVVar4;
  long *plVar5;
  undefined8 *puVar6;
  float fVar7;
  float fVar8;
  
  pVVar4 = (Vec2d *)(**(code **)(*(long *)(&drawable->field_0x0 + *(long *)((long)*drawable + -0x50)
                                          ) + 0x10))
                              (&drawable->field_0x0 + *(long *)((long)*drawable + -0x50));
  iVar3 = (**(code **)(*(long *)(&drawable->field_0x0 + *(long *)((long)*drawable + -0x50)) + 0x28))
                    (&drawable->field_0x0 + *(long *)((long)*drawable + -0x50));
  glPushMatrix();
  fVar7 = Vec2d::getX(pVVar4);
  fVar1 = this->pixelsPerSquare;
  fVar8 = Vec2d::getY(pVVar4);
  glTranslatef((fVar7 + 1.0) * fVar1,(21.0 - fVar8) * this->pixelsPerSquare,0);
  plVar5 = (long *)(**(code **)((long)*drawable + 0x40))(drawable);
  puVar6 = (undefined8 *)*plVar5;
  puVar2 = (undefined8 *)plVar5[1];
  if (puVar6 != puVar2) {
    do {
      quad = (Quad *)*puVar6;
      pVVar4 = (Vec2d *)(**(code **)(*(long *)(&drawable->field_0x0 +
                                              *(long *)((long)*drawable + -0x50)) + 0x30))
                                  (&drawable->field_0x0 + *(long *)((long)*drawable + -0x50));
      drawQuad(this,quad,pVVar4,((float)iVar3 * 3.1415927) / 180.0);
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar2);
  }
  glPopMatrix();
  return;
}

Assistant:

void PrimitiveDisplayer::drawableWithManualRotation(Drawable* drawable) {
    Vec2d* coords = drawable->getCoords();
    float rot = drawable->getRotation() * M_PI / 180;
    
    glPushMatrix();
        glTranslatef((coords->getX() + 1) * pixelsPerSquare, (21 - coords->getY()) * pixelsPerSquare, 0.f);
        for (auto quad : *drawable->getQuads()) {
            drawQuad(quad, drawable->getPivotPoint(), rot);
        }
    glPopMatrix();
    coords = nullptr;
}